

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_DCtx_reset(ZSTD_DCtx *dctx,ZSTD_ResetDirective reset)

{
  if ((reset & ~ZSTD_reset_parameters) == ZSTD_reset_session_only) {
    dctx->streamStage = zdss_init;
    dctx->noForwardProgress = 0;
  }
  if ((reset & ~ZSTD_reset_session_only) == ZSTD_reset_parameters) {
    if (dctx->streamStage != zdss_init) {
      return 0xffffffffffffffc4;
    }
    ZSTD_clearDict(dctx);
    dctx->format = ZSTD_f_zstd1;
    dctx->forceIgnoreChecksum = ZSTD_d_validateChecksum;
    dctx->maxWindowSize = 0x8000001;
    dctx->outBufferMode = ZSTD_bm_buffered;
    dctx->refMultipleDDicts = ZSTD_rmd_refSingleDDict;
  }
  return 0;
}

Assistant:

size_t ZSTD_DCtx_reset(ZSTD_DCtx* dctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        dctx->streamStage = zdss_init;
        dctx->noForwardProgress = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
        ZSTD_clearDict(dctx);
        ZSTD_DCtx_resetParameters(dctx);
    }
    return 0;
}